

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::HasProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl,
          PropertyValueInfo *info)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *this_00;
  ScriptContext *scriptContext;
  PropertyValueInfo *pPStack_38;
  uint32 indexVal;
  PropertyValueInfo *info_local;
  bool *noRedecl_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pPStack_38 = info;
  info_local = (PropertyValueInfo *)noRedecl;
  noRedecl_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  if (info_local != (PropertyValueInfo *)0x0) {
    *(undefined1 *)&info_local->m_instance = 0;
  }
  bVar1 = DynamicObject::HasObjectArray(pDStack_20);
  if ((bVar1) &&
     (BVar2 = ScriptContext::IsNumericPropertyId
                        (this_00,noRedecl_local._4_4_,(uint32 *)((long)&scriptContext + 4)),
     BVar2 != 0)) {
    this_local._4_4_ =
         DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,pDStack_20,scriptContext._4_4_)
    ;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL NullTypeHandlerBase::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        // Check numeric propertyId only if objectArray is available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();

        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return DynamicTypeHandler::HasItem(instance, indexVal);
        }

        return false;
    }